

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBackgroundBorder.cpp
# Opt level: O0

void __thiscall
Rml::GeometryBackgroundBorder::DrawArcPoint
          (GeometryBackgroundBorder *this,Vector2f pos_center,Vector2f pos_inner,float R,float a0,
          float a1,ColourbPremultiplied color0,ColourbPremultiplied color1,int num_points)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  size_type sVar5;
  reference __a;
  reference __b;
  reference pvVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  value_type local_a8;
  int local_8c;
  int i;
  int offset_indices;
  int i_vertex_inner1;
  int i_vertex_inner0;
  int num_triangles;
  int last_vertex;
  Vector2f local_60;
  Vector2f local_58;
  ColourbPremultiplied local_4c;
  Vector2f local_48;
  int local_3c;
  int local_38;
  int offset_vertices;
  int num_points_local;
  float a1_local;
  float a0_local;
  float R_local;
  GeometryBackgroundBorder *this_local;
  ColourbPremultiplied color1_local;
  ColourbPremultiplied color0_local;
  Vector2f pos_inner_local;
  Vector2f pos_center_local;
  
  local_38 = num_points;
  offset_vertices = (int)a1;
  num_points_local = (int)a0;
  a1_local = R;
  _a0_local = this;
  this_local._0_4_ = color1;
  this_local._4_4_ = color0;
  _color1_local = pos_inner;
  if (((R <= 0.0) || (num_points < 2)) &&
     (bVar4 = Assert("RMLUI_ASSERT(R > 0 && num_points >= 2)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBackgroundBorder.cpp"
                     ,299), !bVar4)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  sVar5 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::size(this->vertices);
  local_3c = (int)sVar5;
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::reserve
            (this->vertices,(long)(local_3c + 2 + local_38));
  local_48 = _color1_local;
  local_4c = this_local._4_4_;
  DrawPoint(this,_color1_local,this_local._4_4_);
  local_58 = pos_center;
  Vector2<float>::Vector2(&local_60,a1_local);
  DrawArc(this,local_58,local_60,(float)num_points_local,(float)offset_vertices,this_local._4_4_,
          this_local._0_4_,local_38);
  DrawPoint(this,_color1_local,this_local._0_4_);
  sVar5 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::size(this->vertices);
  if (((int)sVar5 - local_3c != local_38 + 2) &&
     (bVar4 = Assert("RMLUI_ASSERT((int)vertices.size() - offset_vertices == num_points + 2)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBackgroundBorder.cpp"
                     ,0x135), !bVar4)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  sVar5 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::size(this->vertices);
  iVar7 = (int)sVar5;
  __a = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::operator[]
                  (this->vertices,(long)(iVar7 + -2));
  __b = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::operator[]
                  (this->vertices,(long)(iVar7 + -1));
  ::std::swap<Rml::Vector2<float>>(&__a->position,&__b->position);
  iVar3 = local_38;
  iVar2 = local_3c;
  iVar8 = local_38 + -1;
  sVar5 = ::std::vector<int,_std::allocator<int>_>::size(this->indices);
  iVar9 = (int)sVar5;
  ::std::vector<int,_std::allocator<int>_>::resize(this->indices,(long)(iVar9 + iVar8 * 3));
  for (local_8c = 0; local_8c < iVar8; local_8c = local_8c + 1) {
    local_a8 = iVar7 + -2;
    if (local_8c <= iVar8 / 2) {
      local_a8 = iVar2;
    }
    pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       (this->indices,(long)(iVar9 + local_8c * 3));
    *pvVar6 = local_a8;
    iVar10 = local_3c + local_8c;
    pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       (this->indices,(long)(iVar9 + local_8c * 3 + 1));
    *pvVar6 = iVar10 + 2;
    iVar10 = local_3c + local_8c;
    pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       (this->indices,(long)(iVar9 + local_8c * 3 + 2));
    *pvVar6 = iVar10 + 1;
  }
  pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                     (this->indices,(long)(iVar9 + (iVar3 + -2) * 3 + 1));
  *pvVar6 = iVar7 + -1;
  return;
}

Assistant:

void GeometryBackgroundBorder::DrawArcPoint(Vector2f pos_center, Vector2f pos_inner, float R, float a0, float a1, ColourbPremultiplied color0,
	ColourbPremultiplied color1, int num_points)
{
	RMLUI_ASSERT(R > 0 && num_points >= 2);

	const int offset_vertices = (int)vertices.size();
	vertices.reserve(offset_vertices + num_points + 2);

	// Generate the vertices. We could also split the arc mid-way to create a sharp color transition.
	DrawPoint(pos_inner, color0);
	DrawArc(pos_center, Vector2f(R), a0, a1, color0, color1, num_points);
	DrawPoint(pos_inner, color1);

	RMLUI_ASSERT((int)vertices.size() - offset_vertices == num_points + 2);

	// Swap the last two vertices such that the outer edge vertex is last, see the comment for the border drawing functions. Their colors should
	// already be the same.
	const int last_vertex = (int)vertices.size() - 1;
	std::swap(vertices[last_vertex - 1].position, vertices[last_vertex].position);

	// Generate the indices
	const int num_triangles = (num_points - 1);

	const int i_vertex_inner0 = offset_vertices;
	const int i_vertex_inner1 = last_vertex - 1;

	const int offset_indices = (int)indices.size();
	indices.resize(offset_indices + 3 * num_triangles);

	for (int i = 0; i < num_triangles; i++)
	{
		indices[offset_indices + 3 * i + 0] = (i > num_triangles / 2 ? i_vertex_inner1 : i_vertex_inner0);
		indices[offset_indices + 3 * i + 1] = offset_vertices + i + 2;
		indices[offset_indices + 3 * i + 2] = offset_vertices + i + 1;
	}

	// Since we swapped the last two vertices we also need to change the last triangle.
	indices[offset_indices + 3 * (num_triangles - 1) + 1] = last_vertex;
}